

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

void secp256k1_modinv64_update_fg_62_var
               (int len,secp256k1_modinv64_signed62 *f,secp256k1_modinv64_signed62 *g,
               secp256k1_modinv64_trans2x2 *t)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  secp256k1_gej *rzr;
  long lVar7;
  long lVar8;
  code *extraout_RDX;
  ulong unaff_RBX;
  undefined8 unaff_RBP;
  undefined4 in_register_0000003c;
  secp256k1_gej *r;
  ulong in_R8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  secp256k1_modinv64_signed62 *unaff_R12;
  long unaff_R13;
  ulong uVar12;
  ulong unaff_R14;
  ulong unaff_R15;
  secp256k1_scalar sStack_8bc;
  secp256k1_strauss_state sStack_8b8;
  secp256k1_gej sStack_8a0;
  secp256k1_gej sStack_808;
  secp256k1_fe asStack_770 [4];
  secp256k1_ge sStack_6a8;
  secp256k1_ge asStack_640 [4];
  secp256k1_strauss_point_state sStack_4a0;
  ulong uStack_88;
  secp256k1_modinv64_signed62 *psStack_80;
  long lStack_78;
  ulong uStack_70;
  ulong uStack_68;
  code *pcStack_60;
  int local_54;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  r = (secp256k1_gej *)CONCAT44(in_register_0000003c,len);
  if (len < 1) {
LAB_0011eb73:
    g = unaff_R12;
    pcStack_60 = (code *)0x11eb78;
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0011eb78:
    pcStack_60 = (code *)0x11eb7d;
    secp256k1_modinv64_update_fg_62_var_cold_1();
    uVar11 = unaff_R14;
LAB_0011eb7d:
    pcStack_60 = (code *)0x11eb82;
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0011eb82:
    pcStack_60 = (code *)0x11eb87;
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_0011eb87:
    pcStack_60 = (code *)0x11eb8c;
    secp256k1_modinv64_update_fg_62_var_cold_5();
    unaff_R14 = uVar11;
    uVar12 = unaff_R15;
  }
  else {
    local_38 = t->u;
    local_40 = t->v;
    lVar10 = f->v[0];
    in_R8 = g->v[0];
    uVar3 = lVar10 * local_38;
    lVar7 = SUB168(SEXT816(lVar10) * SEXT816(local_38),8);
    uVar4 = in_R8 * local_40;
    unaff_RBX = SUB168(SEXT816((long)in_R8) * SEXT816(local_40),8);
    unaff_R13 = 0x7fffffffffffffff;
    uVar11 = (ulong)(~uVar4 < uVar3);
    lVar8 = (0x7fffffffffffffff - unaff_RBX) - lVar7;
    unaff_R14 = uVar3;
    uVar12 = ~uVar4;
    if ((SBORROW8(0x7fffffffffffffff - unaff_RBX,lVar7) != SBORROW8(lVar8,uVar11)) ==
        (long)(lVar8 - uVar11) < 0 || (long)unaff_RBX < 0) {
      local_48 = t->q;
      uVar12 = t->r;
      unaff_RBX = unaff_RBX + lVar7 + (ulong)CARRY8(uVar4,uVar3);
      uVar5 = lVar10 * local_48;
      unaff_R14 = SUB168(SEXT816(lVar10) * SEXT816(local_48),8);
      auVar1 = SEXT816((long)in_R8);
      in_R8 = in_R8 * uVar12;
      lVar8 = SUB168(auVar1 * SEXT816((long)uVar12),8);
      uVar11 = (ulong)(-in_R8 - 1 < uVar5);
      lVar10 = (0x7fffffffffffffff - lVar8) - unaff_R14;
      bVar6 = (SBORROW8(0x7fffffffffffffff - lVar8,unaff_R14) != SBORROW8(lVar10,uVar11)) !=
              (long)(lVar10 - uVar11) < 0 && -1 < lVar8;
      t = (secp256k1_modinv64_trans2x2 *)CONCAT71((int7)(-in_R8 - 1 >> 8),bVar6);
      local_50 = uVar12;
      if (bVar6) goto LAB_0011eb91;
      bVar6 = CARRY8(in_R8,uVar5);
      in_R8 = in_R8 + uVar5;
      lVar10 = lVar8 + unaff_R14 + (ulong)bVar6;
      unaff_R15 = uVar12;
      if ((uVar4 + uVar3 & 0x3fffffffffffffff) != 0) goto LAB_0011eb78;
      uVar11 = unaff_R14;
      if ((in_R8 & 0x3fffffffffffffff) != 0) goto LAB_0011eb7d;
      in_R8 = in_R8 >> 0x3e | lVar10 * 4;
      uVar3 = uVar4 + uVar3 >> 0x3e | unaff_RBX * 4;
      uVar11 = lVar10 >> 0x3e;
      unaff_RBX = (long)unaff_RBX >> 0x3e;
      local_54 = len;
      if (len != 1) {
        unaff_RBP = 0x3fffffffffffffff;
        r = (secp256k1_gej *)(ulong)(uint)len;
        t = (secp256k1_modinv64_trans2x2 *)0x1;
        do {
          unaff_R14 = f->v[(long)t];
          unaff_R15 = unaff_R14 * local_38 + uVar3;
          lVar7 = SUB168(SEXT816((long)unaff_R14) * SEXT816(local_38),8) + unaff_RBX +
                  (ulong)CARRY8(unaff_R14 * local_38,uVar3);
          lVar10 = g->v[(long)t];
          uVar3 = lVar10 * local_40;
          lVar8 = SUB168(SEXT816(lVar10) * SEXT816(local_40),8);
          if (lVar8 < 0) {
            unaff_R13 = (-0x8000000000000000 - lVar8) - (ulong)(uVar3 != 0);
            unaff_RBX = (lVar7 - unaff_R13) - (ulong)(unaff_R15 < -uVar3);
            if ((SBORROW8(lVar7,unaff_R13) !=
                SBORROW8(lVar7 - unaff_R13,(ulong)(unaff_R15 < -uVar3))) == (long)unaff_RBX < 0)
            goto LAB_0011ea62;
LAB_0011eb69:
            pcStack_60 = (code *)0x11eb6e;
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0011eb6e:
            pcStack_60 = (code *)0x11eb73;
            secp256k1_modinv64_update_fg_62_var_cold_3();
            unaff_R12 = g;
            goto LAB_0011eb73;
          }
          unaff_RBX = -uVar3 - 1;
          lVar9 = (0x7fffffffffffffff - lVar8) - lVar7;
          unaff_R13 = lVar9 - (ulong)(unaff_RBX < unaff_R15);
          if ((SBORROW8(0x7fffffffffffffff - lVar8,lVar7) !=
              SBORROW8(lVar9,(ulong)(unaff_RBX < unaff_R15))) != unaff_R13 < 0) goto LAB_0011eb69;
LAB_0011ea62:
          bVar6 = CARRY8(unaff_R15,uVar3);
          unaff_R15 = unaff_R15 + uVar3;
          lVar8 = lVar7 + lVar8 + (ulong)bVar6;
          unaff_RBX = unaff_R14 * local_48 + in_R8;
          unaff_R14 = SUB168(SEXT816((long)unaff_R14) * SEXT816(local_48),8) + uVar11 +
                      (ulong)CARRY8(unaff_R14 * local_48,in_R8);
          uVar11 = lVar10 * uVar12;
          lVar10 = SUB168(SEXT816(lVar10) * SEXT816((long)uVar12),8);
          if (lVar10 < 0) {
            lVar9 = (-0x8000000000000000 - lVar10) - (ulong)(uVar11 != 0);
            lVar7 = unaff_R14 - lVar9;
            in_R8 = lVar7 - (ulong)(unaff_RBX < -uVar11);
            unaff_R13 = 0x7fffffffffffffff;
            if ((SBORROW8(unaff_R14,lVar9) != SBORROW8(lVar7,(ulong)(unaff_RBX < -uVar11))) !=
                (long)in_R8 < 0) goto LAB_0011eb6e;
          }
          else {
            in_R8 = -uVar11 - 1;
            unaff_R13 = 0x7fffffffffffffff;
            lVar7 = (0x7fffffffffffffff - lVar10) - unaff_R14;
            if ((SBORROW8(0x7fffffffffffffff - lVar10,unaff_R14) !=
                SBORROW8(lVar7,(ulong)(in_R8 < unaff_RBX))) !=
                (long)(lVar7 - (ulong)(in_R8 < unaff_RBX)) < 0) goto LAB_0011eb6e;
          }
          lVar10 = unaff_R14 + lVar10 + (ulong)CARRY8(unaff_RBX,uVar11);
          uVar3 = lVar8 * 4 | unaff_R15 >> 0x3e;
          f->v[(long)&((secp256k1_gej *)((long)t + -0x98))->field_0x97] =
               unaff_R15 & 0x3fffffffffffffff;
          in_R8 = lVar10 * 4 | unaff_RBX + uVar11 >> 0x3e;
          g->v[(long)&((secp256k1_gej *)((long)t + -0x98))->field_0x97] =
               unaff_RBX + uVar11 & 0x3fffffffffffffff;
          t = (secp256k1_modinv64_trans2x2 *)((long)(((secp256k1_gej *)t)->x).n + 1);
          uVar11 = lVar10 >> 0x3e;
          unaff_RBX = lVar8 >> 0x3e;
          unaff_R15 = unaff_R15 & 0x3fffffffffffffff;
        } while (r != (secp256k1_gej *)t);
      }
      unaff_R13 = 0x7fffffffffffffff;
      if ((unaff_RBX - 1) + (ulong)(0x7fffffffffffffff < uVar3) != -1) goto LAB_0011eb82;
      t = (secp256k1_modinv64_trans2x2 *)0xffffffffffffffff;
      f->v[(long)len + -1] = uVar3;
      uVar11 = (uVar11 - 1) + (ulong)(0x7fffffffffffffff < in_R8);
      if (uVar11 == 0xffffffffffffffff) {
        g->v[(long)len + -1] = in_R8;
        return;
      }
      goto LAB_0011eb87;
    }
  }
  pcStack_60 = (code *)0x11eb91;
  secp256k1_modinv64_update_fg_62_var_cold_8();
LAB_0011eb91:
  pcStack_60 = secp256k1_ecmult_multi_simple_var;
  secp256k1_modinv64_update_fg_62_var_cold_7();
  uStack_88 = unaff_RBX;
  psStack_80 = g;
  lStack_78 = unaff_R13;
  uStack_70 = unaff_R14;
  uStack_68 = uVar12;
  pcStack_60 = (code *)unaff_RBP;
  secp256k1_gej_set_infinity(r);
  secp256k1_gej_set_infinity(&sStack_808);
  sStack_8a0.x.n[0] = (uint64_t)asStack_770;
  sStack_8a0.x.n[1] = (uint64_t)asStack_640;
  sStack_8a0.x.n[2] = (uint64_t)&sStack_4a0;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_8a0,r,1,&sStack_808,&secp256k1_scalar_zero,
             (secp256k1_scalar *)f);
  if (in_R8 != 0) {
    uVar12 = 0;
    do {
      iVar2 = (*extraout_RDX)(&sStack_8bc,&sStack_6a8,uVar12,t);
      if (iVar2 == 0) {
        return;
      }
      secp256k1_gej_set_ge(&sStack_8a0,&sStack_6a8);
      sStack_8b8.aux = asStack_770;
      sStack_8b8.pre_a = asStack_640;
      sStack_8b8.ps = &sStack_4a0;
      rzr = &sStack_8a0;
      secp256k1_ecmult_strauss_wnaf
                (&sStack_8b8,&sStack_808,1,&sStack_8a0,&sStack_8bc,(secp256k1_scalar *)0x0);
      secp256k1_gej_add_var(r,r,&sStack_808,&rzr->x);
      uVar12 = uVar12 + 1;
    } while (in_R8 != uVar12);
  }
  return;
}

Assistant:

static void secp256k1_modinv64_update_fg_62_var(int len, secp256k1_modinv64_signed62 *f, secp256k1_modinv64_signed62 *g, const secp256k1_modinv64_trans2x2 *t) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t fi, gi;
    secp256k1_int128 cf, cg;
    int i;
    VERIFY_CHECK(len > 0);
    /* Start computing t*[f,g]. */
    fi = f->v[0];
    gi = g->v[0];
    secp256k1_i128_mul(&cf, u, fi);
    secp256k1_i128_accum_mul(&cf, v, gi);
    secp256k1_i128_mul(&cg, q, fi);
    secp256k1_i128_accum_mul(&cg, r, gi);
    /* Verify that the bottom 62 bits of the result are zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cf) & M62) == 0); secp256k1_i128_rshift(&cf, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&cg) & M62) == 0); secp256k1_i128_rshift(&cg, 62);
    /* Now iteratively compute limb i=1..len of t*[f,g], and store them in output limb i-1 (shifting
     * down by 62 bits). */
    for (i = 1; i < len; ++i) {
        fi = f->v[i];
        gi = g->v[i];
        secp256k1_i128_accum_mul(&cf, u, fi);
        secp256k1_i128_accum_mul(&cf, v, gi);
        secp256k1_i128_accum_mul(&cg, q, fi);
        secp256k1_i128_accum_mul(&cg, r, gi);
        f->v[i - 1] = secp256k1_i128_to_u64(&cf) & M62; secp256k1_i128_rshift(&cf, 62);
        g->v[i - 1] = secp256k1_i128_to_u64(&cg) & M62; secp256k1_i128_rshift(&cg, 62);
    }
    /* What remains is limb (len) of t*[f,g]; store it as output limb (len-1). */
    f->v[len - 1] = secp256k1_i128_to_i64(&cf);
    g->v[len - 1] = secp256k1_i128_to_i64(&cg);
}